

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O3

int BN_sub(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *b_00;
  uint uVar4;
  BIGNUM *a_00;
  
  if (a->neg == 0) {
    uVar4 = 0;
    b_00 = b;
    a_00 = a;
    if (b->neg != 0) goto LAB_0012d99a;
  }
  else {
    b_00 = a;
    a_00 = b;
    if (b->neg == 0) {
      uVar4 = 1;
LAB_0012d99a:
      iVar1 = BN_uadd(r,a,b);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0012d9c2;
    }
  }
  iVar1 = b_00->top;
  if (b_00->top < a_00->top) {
    iVar1 = a_00->top;
  }
  pBVar3 = bn_wexpand((BIGNUM *)r,iVar1);
  if (pBVar3 == (BIGNUM *)0x0) {
    return 0;
  }
  iVar1 = BN_ucmp(a_00,b_00);
  if (iVar1 < 0) {
    iVar2 = BN_usub(r,b_00,a_00);
  }
  else {
    iVar2 = BN_usub(r,a_00,b_00);
  }
  uVar4 = (uint)(iVar1 < 0);
  if (iVar2 == 0) {
    return 0;
  }
LAB_0012d9c2:
  r->neg = uVar4;
  return 1;
}

Assistant:

int BN_sub(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max;
    int add = 0, neg = 0;

    bn_check_top(a);
    bn_check_top(b);

    /*-
     *  a -  b      a-b
     *  a - -b      a+b
     * -a -  b      -(a+b)
     * -a - -b      b-a
     */
    if (a->neg) {
        if (b->neg) {
            const BIGNUM *tmp;

            tmp = a;
            a = b;
            b = tmp;
        } else {
            add = 1;
            neg = 1;
        }
    } else {
        if (b->neg) {
            add = 1;
            neg = 0;
        }
    }

    if (add) {
        if (!BN_uadd(r, a, b))
            return 0;
        r->neg = neg;
        return 1;
    }

    /* We are actually doing a - b :-) */

    max = (a->top > b->top) ? a->top : b->top;
    if (bn_wexpand(r, max) == NULL)
        return 0;
    if (BN_ucmp(a, b) < 0) {
        if (!BN_usub(r, b, a))
            return 0;
        r->neg = 1;
    } else {
        if (!BN_usub(r, a, b))
            return 0;
        r->neg = 0;
    }
    bn_check_top(r);
    return 1;
}